

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddSubDirectoryCommand.cxx
# Opt level: O1

bool __thiscall
cmAddSubDirectoryCommand::InitialPass
          (cmAddSubDirectoryCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  size_type *psVar1;
  long *plVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pbVar4;
  cmCommand *this_00;
  int iVar5;
  string *psVar6;
  ostream *poVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  ulong uVar10;
  pointer pbVar11;
  pointer pbVar12;
  bool bVar13;
  string srcPath;
  string binArg;
  string binPath;
  string error;
  bool local_25c;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  cmCommand *local_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  pointer local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar11 == pbVar4) {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"called with incorrect number of arguments","");
    cmCommand::SetError(&this->super_cmCommand,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return false;
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_local_buf[0] = '\0';
  pbVar12 = pbVar11 + 1;
  bVar13 = pbVar12 == pbVar4;
  local_1d8 = &this->super_cmCommand;
  if (bVar13) {
    local_25c = false;
  }
  else {
    local_25c = false;
    local_1b0 = pbVar11;
    do {
      iVar5 = std::__cxx11::string::compare((char *)pbVar12);
      if (iVar5 == 0) {
        iVar5 = 3;
        local_25c = true;
      }
      else if (local_238._M_string_length == 0) {
        iVar5 = 0;
        std::__cxx11::string::_M_assign((string *)&local_238);
      }
      else {
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1a8,"called with incorrect number of arguments","");
        cmCommand::SetError(local_1d8,(string *)local_1a8);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        iVar5 = 1;
      }
      pbVar11 = local_1b0;
      if ((iVar5 != 3) && (iVar5 != 0)) break;
      pbVar12 = pbVar12 + 1;
      bVar13 = pbVar12 == pbVar4;
    } while (!bVar13);
  }
  if (!bVar13) {
    bVar13 = false;
    goto LAB_0017a33c;
  }
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  bVar13 = cmsys::SystemTools::FileIsFullPath(pbVar11);
  this_00 = local_1d8;
  if (bVar13) {
    std::__cxx11::string::_M_assign((string *)&local_258);
  }
  else {
    cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(local_1d8->Makefile);
    std::__cxx11::string::_M_assign((string *)&local_258);
    std::__cxx11::string::append((char *)&local_258);
    std::__cxx11::string::_M_append((char *)&local_258,(ulong)(pbVar11->_M_dataplus)._M_p);
  }
  bVar13 = cmsys::SystemTools::FileIsDirectory(&local_258);
  if (bVar13) {
    cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_258);
    std::__cxx11::string::operator=((string *)&local_258,(string *)local_1a8);
    plVar2 = (long *)(local_1a8 + 0x10);
    if ((long *)local_1a8._0_8_ != plVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    paVar3 = &local_1f8.field_2;
    local_1f8._M_string_length = 0;
    local_1f8.field_2._M_local_buf[0] = '\0';
    local_1f8._M_dataplus._M_p = (pointer)paVar3;
    if (local_238._M_string_length == 0) {
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00->Makefile);
      bVar13 = cmsys::SystemTools::IsSubDirectory(&local_258,psVar6);
      if (bVar13) {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00->Makefile);
        psVar6 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00->Makefile);
        std::__cxx11::string::substr((ulong)&local_218,(ulong)psVar6);
        std::__cxx11::string::substr((ulong)&local_1d0,(ulong)&local_258);
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          uVar9 = local_218.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_1c8 + local_218._M_string_length) {
          uVar10 = 0xf;
          if (local_1d0 != local_1c0) {
            uVar10 = local_1c0[0];
          }
          if (uVar10 < local_1c8 + local_218._M_string_length) goto LAB_0017a1c9;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_1d0,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
        }
        else {
LAB_0017a1c9:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_1d0);
        }
        psVar1 = puVar8 + 2;
        if ((size_type *)*puVar8 == psVar1) {
          local_1a8._16_8_ = *psVar1;
          local_1a8._24_8_ = puVar8[3];
          local_1a8._0_8_ = plVar2;
        }
        else {
          local_1a8._16_8_ = *psVar1;
          local_1a8._0_8_ = (size_type *)*puVar8;
        }
        local_1a8._8_8_ = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1a8);
        if ((long *)local_1a8._0_8_ != plVar2) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0017a2a4;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"not given a binary directory but the given source directory "
                 ,0x3c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\"",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_258._M_dataplus._M_p,local_258._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"\" is not a subdirectory of \"",0x1c);
      psVar6 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this_00->Makefile);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".  ",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"When specifying an out-of-tree source a binary directory ",0x39);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"must be explicitly specified.",0x1d);
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(this_00,&local_218);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar13 = false;
    }
    else {
      bVar13 = cmsys::SystemTools::FileIsFullPath(&local_238);
      if (bVar13) {
        std::__cxx11::string::_M_assign((string *)&local_1f8);
      }
      else {
        cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this_00->Makefile);
        std::__cxx11::string::_M_assign((string *)&local_1f8);
        std::__cxx11::string::append((char *)&local_1f8);
        std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_238._M_dataplus._M_p);
      }
LAB_0017a2a4:
      cmsys::SystemTools::CollapseFullPath((string *)local_1a8,&local_1f8);
      std::__cxx11::string::operator=((string *)&local_1f8,(string *)local_1a8);
      if ((long *)local_1a8._0_8_ != plVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      bVar13 = true;
      cmMakefile::AddSubDirectory(this_00->Makefile,&local_258,&local_1f8,local_25c,true);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar3) {
      operator_delete(local_1f8._M_dataplus._M_p,
                      CONCAT71(local_1f8.field_2._M_allocated_capacity._1_7_,
                               local_1f8.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"given source \"","");
    std::__cxx11::string::_M_append(local_1a8,(ulong)(pbVar11->_M_dataplus)._M_p);
    std::__cxx11::string::append(local_1a8);
    cmCommand::SetError(this_00,(string *)local_1a8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    bVar13 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
LAB_0017a33c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,
                    CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                             local_238.field_2._M_local_buf[0]) + 1);
  }
  return bVar13;
}

Assistant:

bool cmAddSubDirectoryCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }

  // store the binpath
  std::string const& srcArg = args.front();
  std::string binArg;

  bool excludeFromAll = false;

  // process the rest of the arguments looking for optional args
  for (std::string const& arg : cmMakeRange(args).advance(1)) {
    if (arg == "EXCLUDE_FROM_ALL") {
      excludeFromAll = true;
      continue;
    }
    if (binArg.empty()) {
      binArg = arg;
    } else {
      this->SetError("called with incorrect number of arguments");
      return false;
    }
  }

  // Compute the full path to the specified source directory.
  // Interpret a relative path with respect to the current source directory.
  std::string srcPath;
  if (cmSystemTools::FileIsFullPath(srcArg)) {
    srcPath = srcArg;
  } else {
    srcPath = this->Makefile->GetCurrentSourceDirectory();
    srcPath += "/";
    srcPath += srcArg;
  }
  if (!cmSystemTools::FileIsDirectory(srcPath)) {
    std::string error = "given source \"";
    error += srcArg;
    error += "\" which is not an existing directory.";
    this->SetError(error);
    return false;
  }
  srcPath = cmSystemTools::CollapseFullPath(srcPath);

  // Compute the full path to the binary directory.
  std::string binPath;
  if (binArg.empty()) {
    // No binary directory was specified.  If the source directory is
    // not a subdirectory of the current directory then it is an
    // error.
    if (!cmSystemTools::IsSubDirectory(
          srcPath, this->Makefile->GetCurrentSourceDirectory())) {
      std::ostringstream e;
      e << "not given a binary directory but the given source directory "
        << "\"" << srcPath << "\" is not a subdirectory of \""
        << this->Makefile->GetCurrentSourceDirectory() << "\".  "
        << "When specifying an out-of-tree source a binary directory "
        << "must be explicitly specified.";
      this->SetError(e.str());
      return false;
    }

    // Remove the CurrentDirectory from the srcPath and replace it
    // with the CurrentOutputDirectory.
    const std::string& src = this->Makefile->GetCurrentSourceDirectory();
    const std::string& bin = this->Makefile->GetCurrentBinaryDirectory();
    size_t srcLen = src.length();
    size_t binLen = bin.length();
    if (srcLen > 0 && src.back() == '/') {
      --srcLen;
    }
    if (binLen > 0 && bin.back() == '/') {
      --binLen;
    }
    binPath = bin.substr(0, binLen) + srcPath.substr(srcLen);
  } else {
    // Use the binary directory specified.
    // Interpret a relative path with respect to the current binary directory.
    if (cmSystemTools::FileIsFullPath(binArg)) {
      binPath = binArg;
    } else {
      binPath = this->Makefile->GetCurrentBinaryDirectory();
      binPath += "/";
      binPath += binArg;
    }
  }
  binPath = cmSystemTools::CollapseFullPath(binPath);

  // Add the subdirectory using the computed full paths.
  this->Makefile->AddSubDirectory(srcPath, binPath, excludeFromAll, true);

  return true;
}